

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O1

void Diligent::BasicFileSystem::CorrectSlashes(String *Path,Char Slash)

{
  size_type sVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  undefined7 in_register_00000031;
  size_type sVar5;
  string msg;
  string local_38;
  
  iVar4 = (int)CONCAT71(in_register_00000031,Slash);
  if (iVar4 == 0) {
    Slash = '/';
  }
  else if ((iVar4 != 0x2f) && (iVar4 != 0x5c)) {
    FormatString<char[23]>(&local_38,(char (*) [23])"Incorrect slash symbol");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"CorrectSlashes",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,99);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  cVar3 = '\\';
  if (Slash == '\\') {
    cVar3 = '/';
  }
  sVar1 = Path->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (Path->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      if (pcVar2[sVar5] == cVar3) {
        pcVar2[sVar5] = Slash;
      }
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return;
}

Assistant:

void BasicFileSystem::CorrectSlashes(String& Path, Char Slash)
{
    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;
    Char RevSlashSym = (Slash == '\\') ? '/' : '\\';
    std::replace(Path.begin(), Path.end(), RevSlashSym, Slash);
}